

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_AB_Y(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  byte bVar4;
  
  this->cycles = 4;
  uVar3 = GetWord(this);
  bVar2 = ReadByte(this,this->Y + uVar3);
  bVar1 = this->A;
  bVar4 = bVar1 ^ bVar2;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == bVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_AB_Y()
{
    cycles = 4;
    A ^= ReadByte((uint16_t)(GetWord() + Y));
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}